

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

void __thiscall
imrt::EvaluationFunction::EvaluationFunction
          (EvaluationFunction *this,vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,
          Collimator *collimator)

{
  int iVar1;
  size_type sVar2;
  reference this_00;
  reference pvVar3;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *in_RSI;
  EvaluationFunction *in_RDI;
  vector<int,_std::allocator<int>_> *this_01;
  int i;
  iterator in_stack_fffffffffffffe78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffe80;
  const_iterator in_stack_fffffffffffffe88;
  allocator_type *in_stack_fffffffffffffe90;
  iterator in_stack_fffffffffffffe98;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffea0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_02;
  Collimator *collimator_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *volumes_00;
  allocator_type local_b1 [25];
  vector<double,_std::allocator<double>_> *local_98;
  vector<double,_std::allocator<double>_> *local_88;
  vector<double,_std::allocator<double>_> *local_60;
  int local_4c;
  undefined1 local_45 [69];
  
  in_RDI->_vptr_EvaluationFunction = (_func_int **)&PTR__EvaluationFunction_0019bbe8;
  volumes_00 = &in_RDI->Z;
  local_45._53_8_ = in_RSI;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x12de4a);
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::size
            ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)local_45._53_8_);
  std::allocator<double>::allocator((allocator<double> *)0x12de88);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98._M_current,
             in_stack_fffffffffffffe90);
  collimator_00 = (Collimator *)local_45;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x12deb9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98._M_current,
           (value_type *)in_stack_fffffffffffffe90,
           (allocator_type *)in_stack_fffffffffffffe88._M_current);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x12deed);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe90);
  std::allocator<double>::~allocator((allocator<double> *)0x12df07);
  in_RDI->volumes = (vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)local_45._53_8_;
  sVar2 = std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::size
                    ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)local_45._53_8_);
  in_RDI->nb_organs = (int)sVar2;
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::size
            ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)local_45._53_8_);
  std::allocator<int>::allocator((allocator<int> *)0x12df6c);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
             (size_type)in_stack_fffffffffffffe98._M_current,
             (allocator_type *)in_stack_fffffffffffffe90);
  std::allocator<int>::~allocator((allocator<int> *)0x12df98);
  in_RDI->F = 0.0;
  in_RDI->prev_F = 0.0;
  std::
  set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  ::set((set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
         *)0x12dfbe);
  std::
  unordered_map<std::pair<int,_int>,_double,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::unordered_map((unordered_map<std::pair<int,_int>,_double,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                   *)0x12dfd7);
  std::
  unordered_map<std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::unordered_map((unordered_map<std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                   *)0x12dff0);
  std::
  unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
  ::unordered_map((unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
                   *)0x12e009);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x12e022);
  std::__cxx11::
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ::list((list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
          *)0x12e03b);
  sVar2 = std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::size
                    ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)local_45._53_8_);
  in_RDI->n_volumes = (int)sVar2;
  for (local_4c = 0; local_4c < in_RDI->nb_organs; local_4c = local_4c + 1) {
    this_00 = std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::operator[]
                        ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)local_45._53_8_,
                         (long)local_4c);
    iVar1 = Volume::getNbVoxels(this_00);
    this_01 = &in_RDI->nb_voxels;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_4c);
    *pvVar3 = iVar1;
    this_02 = &in_RDI->Z;
    local_60 = (vector<double,_std::allocator<double>_> *)
               std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)in_stack_fffffffffffffe78._M_current);
    __gnu_cxx::
    __normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
    ::__normal_iterator<std::vector<double,std::allocator<double>>*>
              ((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                *)in_stack_fffffffffffffe80,
               (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                *)in_stack_fffffffffffffe78._M_current);
    std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_4c);
    std::allocator<double>::allocator((allocator<double> *)0x12e11f);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)this_02,
               (size_type)in_stack_fffffffffffffe98._M_current,in_stack_fffffffffffffe90);
    in_stack_fffffffffffffe98 =
         std::
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ::insert(in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
                  in_stack_fffffffffffffe78._M_current);
    local_88 = (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe98;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe90);
    std::allocator<double>::~allocator((allocator<double> *)0x12e180);
    in_stack_fffffffffffffe80 = &in_RDI->D;
    local_98 = (vector<double,_std::allocator<double>_> *)
               std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)in_stack_fffffffffffffe78._M_current);
    __gnu_cxx::
    __normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
    ::__normal_iterator<std::vector<double,std::allocator<double>>*>
              ((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                *)in_stack_fffffffffffffe80,
               (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                *)in_stack_fffffffffffffe78._M_current);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->nb_voxels,(long)local_4c);
    in_stack_fffffffffffffe88._M_current = (vector<double,_std::allocator<double>_> *)(long)*pvVar3;
    in_stack_fffffffffffffe90 = local_b1;
    std::allocator<double>::allocator((allocator<double> *)0x12e1e9);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)this_02,
               (size_type)in_stack_fffffffffffffe98._M_current,in_stack_fffffffffffffe90);
    in_stack_fffffffffffffe78 =
         std::
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ::insert(in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
                  in_stack_fffffffffffffe78._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe90);
    std::allocator<double>::~allocator((allocator<double> *)0x12e248);
  }
  create_voxel2beamlet_list
            (in_RDI,(vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)volumes_00,collimator_00)
  ;
  return;
}

Assistant:

EvaluationFunction::EvaluationFunction(vector<Volume>& volumes, const Collimator& collimator) : prev_F(0.0), F(0.0),
	volumes(volumes), nb_organs(volumes.size()), nb_voxels(volumes.size()), voxel_dose(volumes.size(), vector<double>(150)) {
  n_volumes =volumes.size();
	for(int i=0; i<nb_organs; i++){
		nb_voxels[i]=volumes[i].getNbVoxels();
		Z.insert(Z.end(), vector<double>(nb_voxels[i]));
		D.insert(D.end(), vector<double>(nb_voxels[i]));
	}

	create_voxel2beamlet_list(volumes, collimator);

}